

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void scandir_cb(uv_fs_t *req)

{
  int iVar1;
  char *pcVar2;
  uv_fs_t *puVar3;
  uv_dirent_t dent_00;
  uv_dirent_t dent;
  uv_dirent_t local_38;
  
  if (req == &scandir_req) {
    puVar3 = req;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_0015141d;
    if (scandir_req.result != 2) goto LAB_00151422;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151427;
    puVar3 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
    req = (uv_fs_t *)local_38.name;
    while (iVar1 != -0xfff) {
      pcVar2 = "file1";
      local_38.name = (char *)req;
      iVar1 = strcmp((char *)req,"file1");
      if (iVar1 != 0) {
        pcVar2 = "file2";
        iVar1 = strcmp((char *)req,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00151418;
        }
      }
      dent_00.name = (char *)(ulong)local_38.type;
      dent_00._8_8_ = pcVar2;
      assert_is_file_type(dent_00);
      puVar3 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&local_38);
      req = (uv_fs_t *)local_38.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_0015142c;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_00151431;
    puVar3 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_00151418:
    scandir_cb_cold_1();
    puVar3 = req;
LAB_0015141d:
    scandir_cb_cold_2();
LAB_00151422:
    scandir_cb_cold_3();
LAB_00151427:
    scandir_cb_cold_8();
LAB_0015142c:
    scandir_cb_cold_7();
LAB_00151431:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar3 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar3 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_00151499;
    if (stat_req.result != 0) goto LAB_0015149e;
    if (stat_req.ptr == (void *)0x0) goto LAB_001514a3;
    stat_cb_count = stat_cb_count + 1;
    puVar3 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_00151499:
    stat_cb_cold_2();
LAB_0015149e:
    stat_cb_cold_3();
LAB_001514a3:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar3 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001514e5;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001514e5:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar3 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151549;
    if (rmdir_req.result != 0) goto LAB_0015154e;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00151558;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151549:
    rmdir_cb_cold_2();
LAB_0015154e:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151558:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void scandir_cb(uv_fs_t* req) {
  uv_dirent_t dent;
  ASSERT(req == &scandir_req);
  ASSERT(req->fs_type == UV_FS_SCANDIR);
  ASSERT(req->result == 2);
  ASSERT(req->ptr);

  while (UV_EOF != uv_fs_scandir_next(req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  scandir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}